

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::BinaryStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (BinaryStrOperator *this,string_t input,Vector *result)

{
  byte bVar1;
  idx_t i;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  string_t target;
  string_t input_local;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  pcVar4 = input_local.value.pointer.ptr;
  if ((uint)this < 0xd) {
    pcVar4 = input_local.value.pointer.prefix;
  }
  input_local.value._0_8_ = this;
  target = StringVector::EmptyString
                     (input.value._8_8_,(Vector *)(((ulong)this & 0xffffffff) * 8),
                      (idx_t)input.value._8_8_);
  pcVar3 = target.value._8_8_;
  if (target.value._0_4_ < 0xd) {
    pcVar3 = target.value.pointer.prefix;
  }
  for (uVar2 = 0; uVar2 != ((ulong)this & 0xffffffff); uVar2 = uVar2 + 1) {
    bVar1 = pcVar4[uVar2];
    lVar5 = 8;
    while (lVar5 != 0) {
      lVar5 = lVar5 + -1;
      *pcVar3 = (bVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0 | 0x30;
      pcVar3 = pcVar3 + 1;
    }
  }
  string_t::Finalize(&target);
  return (string_t)target.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 8);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			auto byte = static_cast<uint8_t>(data[i]);
			for (idx_t i = 8; i >= 1; --i) {
				*output = ((byte >> (i - 1)) & 0x01) + '0';
				output++;
			}
		}

		target.Finalize();
		return target;
	}